

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Ok> *
wasm::WATParser::params<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx,bool allowNames)

{
  __index_type *p_Var1;
  size_t sVar2;
  char *pcVar3;
  undefined8 pos_00;
  ParseDeclsCtx *pPVar4;
  bool bVar5;
  Name *pNVar6;
  basic_string_view<char,_std::char_traits<char>_> expected;
  Name local_218;
  Err local_208;
  Err *local_1e8;
  Err *err_1;
  Result<wasm::Ok> _val_1;
  Result<wasm::Ok> type_1;
  allocator<char> local_169;
  string local_168;
  Err local_148;
  uint local_124;
  Err local_120;
  Err *local_100;
  Err *err;
  Result<wasm::Ok> _val;
  Result<wasm::Ok> type;
  allocator<char> local_91;
  string local_90;
  Err local_70;
  undefined1 local_50 [8];
  optional<wasm::Name> id;
  size_t pos;
  Ok local_1b;
  byte local_1a;
  byte local_19;
  ParamsT res;
  bool hasAny;
  ParseDeclsCtx *pPStack_18;
  bool allowNames_local;
  ParseDeclsCtx *ctx_local;
  
  local_1a = 0;
  local_19 = allowNames;
  pPStack_18 = ctx;
  NullTypeParserCtx::makeParams((NullTypeParserCtx *)ctx);
  do {
    while( true ) {
      pPVar4 = pPStack_18;
      expected = sv("param",5);
      bVar5 = Lexer::takeSExprStart(&pPVar4->in,expected);
      if (!bVar5) {
        if ((local_1a & 1) != 0) {
          MaybeResult<wasm::Ok>::MaybeResult<wasm::Ok>(__return_storage_ptr__,&local_1b);
          return __return_storage_ptr__;
        }
        MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      local_1a = 1;
      id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Name>._16_8_ = Lexer::getPos(&pPStack_18->in);
      Lexer::takeID((optional<wasm::Name> *)local_50,&pPStack_18->in);
      bVar5 = std::optional::operator_cast_to_bool((optional *)local_50);
      pPVar4 = pPStack_18;
      pos_00 = id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._16_8_;
      if (bVar5) break;
      while (bVar5 = Lexer::takeRParen(&pPStack_18->in), ((bVar5 ^ 0xffU) & 1) != 0) {
        p_Var1 = (__index_type *)
                 ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
        valtype<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)p_Var1,pPStack_18);
        Result<wasm::Ok>::Result((Result<wasm::Ok> *)&err_1,(Result<wasm::Ok> *)p_Var1);
        local_1e8 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_1);
        bVar5 = local_1e8 != (Err *)0x0;
        if (bVar5) {
          wasm::Err::Err(&local_208,local_1e8);
          MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_208);
          wasm::Err::~Err(&local_208);
        }
        local_124 = (uint)bVar5;
        Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_1);
        pPVar4 = pPStack_18;
        if (local_124 == 0) {
          wasm::Name::Name(&local_218);
          Result<wasm::Ok>::operator*
                    ((Result<wasm::Ok> *)
                     ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          NullTypeParserCtx::appendParam
                    ((NullTypeParserCtx *)pPVar4,&local_1b,local_218.super_IString.str._M_len,
                     local_218.super_IString.str._M_str);
          local_124 = 0;
        }
        Result<wasm::Ok>::~Result
                  ((Result<wasm::Ok> *)
                   ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        if (local_124 != 0) {
          return __return_storage_ptr__;
        }
      }
    }
    if ((local_19 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"unexpected named parameter",&local_91);
      Lexer::err(&local_70,&pPVar4->in,pos_00,&local_90);
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_70);
      wasm::Err::~Err(&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator(&local_91);
      return __return_storage_ptr__;
    }
    p_Var1 = (__index_type *)
             ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
    valtype<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)p_Var1,pPStack_18);
    Result<wasm::Ok>::Result((Result<wasm::Ok> *)&err,(Result<wasm::Ok> *)p_Var1);
    local_100 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
    bVar5 = local_100 != (Err *)0x0;
    if (bVar5) {
      wasm::Err::Err(&local_120,local_100);
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_120);
      wasm::Err::~Err(&local_120);
    }
    local_124 = (uint)bVar5;
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
    if (local_124 == 0) {
      bVar5 = Lexer::takeRParen(&pPStack_18->in);
      pPVar4 = pPStack_18;
      if (bVar5) {
        pNVar6 = std::optional<wasm::Name>::operator*((optional<wasm::Name> *)local_50);
        sVar2 = (pNVar6->super_IString).str._M_len;
        pcVar3 = (pNVar6->super_IString).str._M_str;
        Result<wasm::Ok>::operator*
                  ((Result<wasm::Ok> *)
                   ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        NullTypeParserCtx::appendParam((NullTypeParserCtx *)pPVar4,&local_1b,sVar2,pcVar3);
        local_124 = 0;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_168,"expected end of param",&local_169);
        Lexer::err(&local_148,&pPVar4->in,&local_168);
        MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_148);
        wasm::Err::~Err(&local_148);
        std::__cxx11::string::~string((string *)&local_168);
        std::allocator<char>::~allocator(&local_169);
        local_124 = 1;
      }
    }
    Result<wasm::Ok>::~Result
              ((Result<wasm::Ok> *)
               ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  } while (local_124 == 0);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::ParamsT> params(Ctx& ctx, bool allowNames) {
  bool hasAny = false;
  auto res = ctx.makeParams();
  while (ctx.in.takeSExprStart("param"sv)) {
    hasAny = true;
    auto pos = ctx.in.getPos();
    if (auto id = ctx.in.takeID()) {
      // Single named param
      if (!allowNames) {
        return ctx.in.err(pos, "unexpected named parameter");
      }
      auto type = valtype(ctx);
      CHECK_ERR(type);
      if (!ctx.in.takeRParen()) {
        return ctx.in.err("expected end of param");
      }
      ctx.appendParam(res, *id, *type);
    } else {
      // Repeated unnamed params
      while (!ctx.in.takeRParen()) {
        auto type = valtype(ctx);
        CHECK_ERR(type);
        ctx.appendParam(res, {}, *type);
      }
    }
  }
  if (hasAny) {
    return res;
  }
  return {};
}